

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O2

uint capnp::anon_unknown_1::CapnpcCppMain::typeSizeBits(Which whichType)

{
  uint uVar1;
  undefined6 in_register_0000003a;
  Fault f;
  
  uVar1 = (uint)CONCAT62(in_register_0000003a,whichType);
  switch(CONCAT62(in_register_0000003a,whichType) & 0xffffffff) {
  case 0:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0x10:
  case 0x11:
  case 0x12:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[38]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/capnpc-c++.c++"
               ,0x3af,FAILED,(char *)0x0,"\"Should only be called for data types.\"",
               (char (*) [38])"Should only be called for data types.");
    kj::_::Debug::Fault::fatal(&f);
  case 1:
    break;
  case 2:
  case 6:
    uVar1 = 8;
    break;
  case 3:
  case 7:
  case 0xf:
    uVar1 = 0x10;
    break;
  case 4:
  case 8:
  case 10:
    uVar1 = 0x20;
    break;
  case 5:
  case 9:
  case 0xb:
    uVar1 = 0x40;
    break;
  default:
    kj::_::unreachable();
  }
  return uVar1;
}

Assistant:

static uint typeSizeBits(schema::Type::Which whichType) {
    switch (whichType) {
      case schema::Type::BOOL: return 1;
      case schema::Type::INT8: return 8;
      case schema::Type::INT16: return 16;
      case schema::Type::INT32: return 32;
      case schema::Type::INT64: return 64;
      case schema::Type::UINT8: return 8;
      case schema::Type::UINT16: return 16;
      case schema::Type::UINT32: return 32;
      case schema::Type::UINT64: return 64;
      case schema::Type::FLOAT32: return 32;
      case schema::Type::FLOAT64: return 64;
      case schema::Type::ENUM: return 16;

      case schema::Type::VOID:
      case schema::Type::TEXT:
      case schema::Type::DATA:
      case schema::Type::LIST:
      case schema::Type::STRUCT:
      case schema::Type::INTERFACE:
      case schema::Type::ANY_POINTER:
        KJ_FAIL_REQUIRE("Should only be called for data types.");
    }
    KJ_UNREACHABLE;
  }